

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::util_convertWorkingToBaseStat(HModel *this,int *cstat,int *rstat)

{
  double dVar1;
  value_type vVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  reference pvVar8;
  uint *puVar9;
  long in_RDX;
  long in_RSI;
  HModel *in_RDI;
  int var_1;
  int row;
  int var;
  int col;
  uint local_2c;
  uint local_24;
  
  if (in_RSI != 0) {
    for (local_24 = 0; (int)local_24 < in_RDI->numCol; local_24 = local_24 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->nonbasicFlag,(long)(int)local_24);
      if (*pvVar7 == 0) {
        *(undefined4 *)(in_RSI + (long)(int)local_24 * 4) = 1;
      }
      else {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->nonbasicMove,(long)(int)local_24);
        if (*pvVar7 == 1) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->colLower,(long)(int)local_24);
          bVar5 = hsol_isInfinity(in_RDI,-*pvVar8);
          if (bVar5) goto LAB_00182573;
          *(undefined4 *)(in_RSI + (long)(int)local_24 * 4) = 0;
        }
        else {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->nonbasicMove,(long)(int)local_24);
          if (*pvVar7 == -1) {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colUpper,(long)(int)local_24);
            bVar5 = hsol_isInfinity(in_RDI,*pvVar8);
            if (bVar5) {
LAB_00182573:
              puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                         (&in_RDI->nonbasicFlag,(long)(int)local_24);
              uVar3 = *puVar9;
              puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                         (&in_RDI->nonbasicMove,(long)(int)local_24);
              uVar4 = *puVar9;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&in_RDI->colLower,(long)(int)local_24);
              vVar2 = *pvVar8;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&in_RDI->colUpper,(long)(int)local_24);
              printf("Invalid basis status: col=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n"
                     ,vVar2,*pvVar8,(ulong)local_24,(ulong)uVar3,(ulong)uVar4);
              return local_24 + 1;
            }
            *(undefined4 *)(in_RSI + (long)(int)local_24 * 4) = 2;
          }
          else {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->nonbasicMove,(long)(int)local_24);
            if (*pvVar7 != 0) goto LAB_00182573;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colLower,(long)(int)local_24);
            dVar1 = *pvVar8;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->colUpper,(long)(int)local_24);
            if ((dVar1 != *pvVar8) || (NAN(dVar1) || NAN(*pvVar8))) {
              *(undefined4 *)(in_RSI + (long)(int)local_24 * 4) = 3;
            }
            else {
              *(undefined4 *)(in_RSI + (long)(int)local_24 * 4) = 0;
            }
          }
        }
      }
    }
  }
  if (in_RDX != 0) {
    for (local_2c = 0; (int)local_2c < in_RDI->numRow; local_2c = local_2c + 1) {
      iVar6 = in_RDI->numCol + local_2c;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nonbasicFlag,(long)iVar6)
      ;
      if (*pvVar7 == 0) {
        *(undefined4 *)(in_RDX + (long)(int)local_2c * 4) = 1;
      }
      else {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->nonbasicMove,(long)iVar6);
        if (*pvVar7 == -1) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->rowLower,(long)(int)local_2c);
          bVar5 = hsol_isInfinity(in_RDI,-*pvVar8);
          if (bVar5) goto LAB_001827fb;
          *(undefined4 *)(in_RDX + (long)(int)local_2c * 4) = 0;
        }
        else {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->nonbasicMove,(long)iVar6);
          if (*pvVar7 == 1) {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowUpper,(long)(int)local_2c);
            bVar5 = hsol_isInfinity(in_RDI,*pvVar8);
            if (bVar5) {
LAB_001827fb:
              puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                         (&in_RDI->nonbasicFlag,(long)iVar6);
              uVar3 = *puVar9;
              puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                         (&in_RDI->nonbasicMove,(long)iVar6);
              uVar4 = *puVar9;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&in_RDI->rowLower,(long)(int)local_2c);
              vVar2 = *pvVar8;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&in_RDI->rowUpper,(long)(int)local_2c);
              printf("Invalid basis status: row=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n"
                     ,vVar2,*pvVar8,(ulong)local_2c,(ulong)uVar3,(ulong)uVar4);
              return -(local_2c + 1);
            }
            *(undefined4 *)(in_RDX + (long)(int)local_2c * 4) = 2;
          }
          else {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->nonbasicMove,(long)iVar6);
            if (*pvVar7 != 0) goto LAB_001827fb;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowLower,(long)(int)local_2c);
            dVar1 = *pvVar8;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&in_RDI->rowUpper,(long)(int)local_2c);
            if ((dVar1 != *pvVar8) || (NAN(dVar1) || NAN(*pvVar8))) {
              *(undefined4 *)(in_RDX + (long)(int)local_2c * 4) = 3;
            }
            else {
              *(undefined4 *)(in_RDX + (long)(int)local_2c * 4) = 0;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int HModel::util_convertWorkingToBaseStat(int* cstat, int* rstat) {
  if (cstat != NULL)
    {
      for (int col = 0; col < numCol; col++) {
	int var = col;
	if (!nonbasicFlag[var]) {
	  cstat[col] = HSOL_BASESTAT_BASIC;
	  continue;
	}
	else if (nonbasicMove[var] == NONBASIC_MOVE_UP) 
	  {
#ifdef H2DEBUG
	    if (!hsol_isInfinity(-colLower[col])) 
#endif
	      {
		cstat[col] = HSOL_BASESTAT_LOWER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_DN)
	  {
#ifdef H2DEBUG
            if (!hsol_isInfinity(colUpper[col])) 
#endif
	      {
		cstat[col] = HSOL_BASESTAT_UPPER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_ZE)
	  {
            if (colLower[col] == colUpper[col])
	      {
#ifndef H2DEBUG
		if (!hsol_isInfinity(colUpper[col]))
#endif
		  {
		    cstat[col] = HSOL_BASESTAT_LOWER;
		    continue;
		  }
	      }
            else
	      {
#ifndef H2DEBUG
		if (hsol_isInfinity(-colLower[col]) && hsol_isInfinity(colLower[col]))
#endif
		  {
		    cstat[col] = HSOL_BASESTAT_ZERO;
		    continue;
		  }
	      }
	  }
#ifdef JAJH_dev
	printf("Invalid basis status: col=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n",
	       col, nonbasicFlag[var], nonbasicMove[var], colLower[col], colUpper[col]);
#endif
	return col+1;
      }
    }
  if (rstat != NULL)
    {
      for (int row = 0; row < numRow; row++) {
	int var = numCol+row;
	if (!nonbasicFlag[var]) {
	  rstat[row] = HSOL_BASESTAT_BASIC;
	  continue;
	}
	//NB nonbasicMove for rows refers to the solver's view where the bounds are switched and negated
	else if (nonbasicMove[var] == NONBASIC_MOVE_DN)
	  //Free to move only down from -rowLower[row]
	  {
#ifdef H2DEBUG
	    if (!hsol_isInfinity(-rowLower[row])) 
#endif
	      {
		rstat[row] = HSOL_BASESTAT_LOWER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_UP)
	  //Free to move only up from -rowUpper[row]
	  {
#ifdef H2DEBUG
            if (!hsol_isInfinity(rowUpper[row])) 
#endif
	      {
		rstat[row] = HSOL_BASESTAT_UPPER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_ZE)
	  {
            if (rowLower[row] == rowUpper[row])
	      {
#ifndef H2DEBUG
		if (!hsol_isInfinity(rowUpper[row]))
#endif
		  {
		    rstat[row] = HSOL_BASESTAT_LOWER;
		    continue;
		  }
	      }
            else
	      {
#ifndef H2DEBUG
		if (hsol_isInfinity(-rowLower[row]) && hsol_isInfinity(rowLower[row]))
#endif
		  {
		    rstat[row] = HSOL_BASESTAT_ZERO;
		    continue;
		  }
	      }
	  }
#ifdef JAJH_dev
	printf("Invalid basis status: row=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n",
	       row, nonbasicFlag[var], nonbasicMove[var], rowLower[row], rowUpper[row]);
#endif
	return -(row+1);
      }
    }
  return 0;
}